

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_nonexist_many_string_key(planck_unit_test_t *tc)

{
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_edge_cases);
  sprintf(key,"k%d",0xfffff830);
  bhdct_get(tc,&dict,key,(ion_value_t)0x0,'\x01',0);
  sprintf(key,"k%d",3000);
  bhdct_get(tc,&dict,key,(ion_value_t)0x0,'\x01',0);
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_nonexist_many_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, -2000);
	bhdct_get(tc, &dict, key, NULL, err_item_not_found, 0);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 3000);
	bhdct_get(tc, &dict, key, NULL, err_item_not_found, 0);

	bhdct_takedown(tc, &dict);
}